

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  internals *piVar4;
  value_type p_Var5;
  reference pp_Var6;
  pointer pvVar7;
  reference pptVar8;
  reference pptVar9;
  undefined1 *puVar10;
  PyObject **ppPVar11;
  value_type local_120;
  handle local_118;
  handle parent_1;
  tuple_iterator __end5_1;
  tuple_iterator __begin5_1;
  tuple local_f8;
  tuple *local_f0;
  tuple *__range5_1;
  type_info *known;
  iterator __end5;
  iterator __begin5;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  type_info *ptStack_c0;
  bool found;
  type_info *tinfo;
  const_iterator __end4;
  const_iterator __begin4;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range4;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_98;
  const_iterator it;
  value_type type;
  size_t i;
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  *type_dict;
  handle local_70;
  handle parent;
  tuple_iterator __end2;
  tuple_iterator __begin2;
  handle local_48;
  tuple local_40;
  tuple *local_38;
  tuple *__range2;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *bases_local
  ;
  PyTypeObject *t_local;
  
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bases;
  std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::vector
            ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2);
  handle::handle(&local_48,t->tp_bases);
  reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_40,local_48);
  local_38 = &local_40;
  __end2 = tuple::begin(local_38);
  parent.m_ptr = (PyObject *)tuple::end(local_38);
  while (bVar1 = operator!=(&__end2,(It *)&parent), bVar1) {
    local_70.m_ptr =
         (PyObject *)
         generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator*
                   (&__end2);
    ppPVar11 = handle::ptr(&local_70);
    type_dict = (unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                 *)*ppPVar11;
    std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::push_back
              ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2,
               (value_type *)&type_dict);
    generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
              (&__end2);
  }
  tuple::~tuple(&local_40);
  piVar4 = get_internals();
  type = (value_type)0x0;
  do {
    p_Var5 = (value_type)
             std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::size
                       ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2);
    if (p_Var5 <= type) {
      std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::~vector
                ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2);
      return;
    }
    pp_Var6 = std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::operator[]
                        ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2,
                         (size_type)type);
    it.
    super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )*pp_Var6;
    iVar3 = _PyType_Check((PyObject *)
                          it.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur);
    if (iVar3 != 0) {
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
           ::find(&piVar4->registered_types_py,(key_type *)&it);
      __range4 = (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)std::
                    unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                    ::end(&piVar4->registered_types_py);
      bVar1 = std::__detail::operator!=
                        (&local_98,
                         (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          *)&__range4);
      if (bVar1) {
        pvVar7 = std::__detail::
                 _Node_const_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                               *)&local_98);
        __end4 = std::
                 vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 ::begin(&pvVar7->second);
        tinfo = (type_info *)
                std::
                vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                ::end(&pvVar7->second);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                           *)&tinfo), bVar1) {
          pptVar8 = __gnu_cxx::
                    __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                    ::operator*(&__end4);
          this = check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          ptStack_c0 = *pptVar8;
          bVar1 = false;
          __end5 = std::
                   vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                   ::begin((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            *)check.
                              super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          known = (type_info *)
                  std::
                  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  ::end((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         *)this);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                             *)&known), bVar2) {
            pptVar9 = __gnu_cxx::
                      __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                      ::operator*(&__end5);
            __range5_1 = (tuple *)*pptVar9;
            if ((type_info *)__range5_1 == ptStack_c0) {
              bVar1 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
            ::operator++(&__end5);
          }
          if (!bVar1) {
            std::
            vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
            push_back((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffff40)
            ;
          }
          __gnu_cxx::
          __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
          ::operator++(&__end4);
        }
      }
      else if (*(long *)((long)it.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                               ._M_cur + 0x150) != 0) {
        puVar10 = (undefined1 *)
                  std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::size
                            ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2);
        if ((undefined1 *)((long)&(type->ob_base).ob_base.ob_refcnt + 1U) == puVar10) {
          std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::pop_back
                    ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2);
          type = (value_type)((long)&type[-1].tp_vectorcall + 7);
        }
        handle::handle((handle *)&__begin5_1,
                       *(PyObject **)
                        ((long)it.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                               ._M_cur + 0x150));
        reinterpret_borrow<pybind11::tuple>
                  ((pybind11 *)&local_f8,(handle)__begin5_1.super_sequence_fast_readonly.ptr);
        local_f0 = &local_f8;
        __end5_1 = tuple::begin(local_f0);
        parent_1.m_ptr = (PyObject *)tuple::end(local_f0);
        while (bVar1 = operator!=(&__end5_1,(It *)&parent_1), bVar1) {
          local_118.m_ptr =
               (PyObject *)
               generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::
               operator*(&__end5_1);
          ppPVar11 = handle::ptr(&local_118);
          local_120 = (value_type)*ppPVar11;
          std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::push_back
                    ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)&__range2,&local_120);
          generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
                    (&__end5_1);
        }
        tuple::~tuple(&local_f8);
      }
    }
    type = (value_type)((long)&(type->ob_base).ob_base.ob_refcnt + 1);
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}